

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main-x11.c
# Opt level: O1

errr Term_xtra_x11(wchar_t n,wchar_t v)

{
  uint8_t red;
  uint8_t green;
  uint8_t blue;
  void *pvVar1;
  undefined8 *puVar2;
  ulong uVar3;
  uint32_t uVar4;
  errr eVar5;
  ulong uVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  _Bool wait;
  undefined1 local_a0 [8];
  ulong local_98;
  
  eVar5 = 1;
  switch(n) {
  case L'\x01':
    wait = v != L'\0';
    goto LAB_001251c6;
  case L'\x02':
    do {
      eVar5 = CheckEvent(false);
    } while (eVar5 == 0);
    return 0;
  case L'\x03':
    XClearWindow(metadpy_default_0,Infowin->win);
    break;
  default:
    goto switchD_0012519d_caseD_4;
  case L'\x06':
    XFlush(metadpy_default_0);
    break;
  case L'\a':
    XBell(metadpy_default_0,100);
    break;
  case L'\t':
    wait = false;
LAB_001251c6:
    eVar5 = CheckEvent(wait);
    return eVar5;
  case L'\n':
    if ((metadpy_default_16 & 2) == 0) {
      return 0;
    }
    lVar9 = 0;
    do {
      if ((((color_table_x11[lVar9][0] != angband_color_table[lVar9][0]) ||
           (color_table_x11[lVar9][1] != angband_color_table[lVar9][1])) ||
          (color_table_x11[lVar9][2] != angband_color_table[lVar9][2])) ||
         (color_table_x11[lVar9][3] != angband_color_table[lVar9][3])) {
        color_table_x11[lVar9][0] = angband_color_table[lVar9][0];
        red = angband_color_table[lVar9][1];
        color_table_x11[lVar9][1] = red;
        green = angband_color_table[lVar9][2];
        color_table_x11[lVar9][2] = green;
        blue = angband_color_table[lVar9][3];
        color_table_x11[lVar9][3] = blue;
        uVar4 = create_pixel(metadpy_default_0,red,green,blue);
        uVar6 = (ulong)uVar4;
        Infoclr = clr[lVar9];
        if (uVar6 <= metadpy_default_15) {
          XSetForeground(metadpy_default_0,Infoclr->gc,uVar6);
        }
        iVar8 = (int)lVar9;
        if (iVar8 == 0) {
          lVar7 = 0;
          metadpy_default_13 = uVar6;
          do {
            Infoclr = *(infoclr **)((long)clr + lVar7);
            if (uVar6 <= metadpy_default_15) {
              XSetBackground(metadpy_default_0,Infoclr->gc,uVar6);
            }
            lVar7 = lVar7 + 8;
            uVar3 = metadpy_default_14;
          } while (lVar7 != 0x100);
        }
        else {
          uVar3 = uVar6;
          if ((iVar8 != 1) && (uVar3 = metadpy_default_14, iVar8 == 0x1c)) {
            lVar7 = 0;
            do {
              Infoclr = clr[lVar7 + 0x40];
              if (uVar6 <= metadpy_default_15) {
                XSetBackground(metadpy_default_0,Infoclr->gc,uVar6);
              }
              lVar7 = lVar7 + 1;
              uVar3 = metadpy_default_14;
            } while (lVar7 != 0x20);
          }
        }
        metadpy_default_14 = uVar3;
        Infoclr = clr[lVar9 + 0x20];
        if (uVar6 <= metadpy_default_15) {
          XSetForeground(metadpy_default_0,Infoclr->gc,uVar6);
        }
        if (uVar6 <= metadpy_default_15) {
          XSetBackground(metadpy_default_0,Infoclr->gc,uVar6);
        }
        Infoclr = clr[lVar9 + 0x40];
        if (uVar6 <= metadpy_default_15) {
          XSetForeground(metadpy_default_0,Infoclr->gc,uVar6);
        }
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 != 0x20);
    local_98 = metadpy_default_13;
    lVar9 = 0;
    do {
      if (((angband_term[lVar9] != (term *)0x0) &&
          (pvVar1 = angband_term[lVar9]->data, pvVar1 != (void *)0x0)) &&
         (puVar2 = *(undefined8 **)((long)pvVar1 + 0xe0), puVar2 != (undefined8 *)0x0)) {
        XChangeWindowAttributes(metadpy_default_0,*puVar2,2,local_a0);
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 != 8);
    break;
  case L'\f':
    if (v == L'\0') {
      return 0;
    }
    Infowin = *(infowin **)((long)Term->data + 0xe0);
    Infofnt = *(infofnt **)((long)Term->data + 0xd8);
    return 0;
  case L'\r':
    eVar5 = 0;
    if (L'\0' < v) {
      usleep(v * 1000);
    }
    goto switchD_0012519d_caseD_4;
  }
  eVar5 = 0;
switchD_0012519d_caseD_4:
  return eVar5;
}

Assistant:

static errr Term_xtra_x11(int n, int v)
{
	/* Handle a subset of the legal requests */
	switch (n)
	{
		/* Make a noise */
		case TERM_XTRA_NOISE: Metadpy_do_beep(); return (0);

		/* Flush the output XXX XXX */
		case TERM_XTRA_FRESH: Metadpy_update(1, 0, 0); return (0);

		/* Process random events XXX */
		case TERM_XTRA_BORED: return (CheckEvent(0));

		/* Process Events XXX */
		case TERM_XTRA_EVENT: return (CheckEvent(v));

		/* Flush the events XXX */
		case TERM_XTRA_FLUSH: while (!CheckEvent(false)); return (0);

		/* Handle change in the "level" */
		case TERM_XTRA_LEVEL: return (Term_xtra_x11_level(v));

		/* Clear the screen */
		case TERM_XTRA_CLEAR: Infowin_wipe(); return (0);

		/* Delay for some milliseconds */
		case TERM_XTRA_DELAY:
			if (v > 0) usleep(1000 * v);
			return (0);

		/* React to changes */
		case TERM_XTRA_REACT: return (Term_xtra_x11_react());
	}

	/* Unknown */
	return (1);
}